

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerSettings.cpp
# Opt level: O0

void __thiscall HdlcAnalyzerSettings::HdlcAnalyzerSettings(HdlcAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  element_type *peVar1;
  AnalyzerSettingInterfaceInteger *this_01;
  element_type *peVar2;
  AnalyzerSettingInterfaceNumberList *pAVar3;
  element_type *peVar4;
  Channel *pCVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  HdlcAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__HdlcAnalyzerSettings_0012fd70;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 2000000;
  this->mTransmissionMode = HDLC_TRANSMISSION_BIT_SYNC;
  this->mHdlcAddr = HDLC_BASIC_ADDRESS_FIELD;
  this->mHdlcControl = HDLC_BASIC_CONTROL_FIELD;
  this->mHdlcFcs = HDLC_CRC16;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mInputChannelInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::auto_ptr
            (&this->mBitRateInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mHdlcAddrInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mHdlcTransmissionInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mHdlcControlInterface,(element_type *)0x0);
  uVar6 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mHdlcFcsInterface,(element_type *)0x0);
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar6);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mInputChannelInterface,this_00);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar1,"HDLC");
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  pCVar5 = &this->mInputChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  this_01 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar5);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_01);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(&this->mBitRateInterface,this_01);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar2,"Baud Rate");
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMax((int)peVar2);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMin((int)peVar2);
  peVar2 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  uVar6 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)peVar2);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar6);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mHdlcTransmissionInterface,pAVar3)
  ;
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mHdlcTransmissionInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"Transmission Mode");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mHdlcTransmissionInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar4,"Bit Synchronous");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mHdlcTransmissionInterface);
  pcVar7 = "Byte Asynchronous";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar4,"Byte Asynchronous");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcTransmissionInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mTransmissionMode);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mHdlcAddrInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcAddrInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"Address Field Type");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcAddrInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar4,"Basic");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcAddrInterface);
  pcVar7 = "Extended";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar4,"Extended");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcAddrInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mHdlcAddr);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mHdlcControlInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mHdlcControlInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"Control Field Format");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mHdlcControlInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar4,"Basic - Modulo 8");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mHdlcControlInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar4,"Extended - Modulo 128");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mHdlcControlInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)peVar4,"Extended - Modulo 32768");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mHdlcControlInterface);
  pcVar7 = "Extended - Modulo 2147483648";
  AnalyzerSettingInterfaceNumberList::AddNumber(3.0,(char *)peVar4,"Extended - Modulo 2147483648");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcControlInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mHdlcControl);
  pAVar3 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar3);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mHdlcFcsInterface,pAVar3);
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcFcsInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar4,"FCS Type");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcFcsInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar4,"CRC-8");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcFcsInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar4,"CRC-16-CCITT");
  peVar4 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcFcsInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)peVar4,"CRC-32");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mHdlcFcsInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mHdlcFcs);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mInputChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::get(&this->mBitRateInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mHdlcTransmissionInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mHdlcAddrInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mHdlcControlInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mHdlcFcsInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar8 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar8,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return;
}

Assistant:

HdlcAnalyzerSettings::HdlcAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mBitRate( 2000000 ),
      mTransmissionMode( HDLC_TRANSMISSION_BIT_SYNC ),
      mHdlcAddr( HDLC_BASIC_ADDRESS_FIELD ),
      mHdlcControl( HDLC_BASIC_CONTROL_FIELD ),
      mHdlcFcs( HDLC_CRC16 )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "HDLC", "Standard HDLC" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Baud Rate", "Specify the baud rate in symbols per second." );
    mBitRateInterface->SetMax( 6000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( mBitRate );

    mHdlcTransmissionInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcTransmissionInterface->SetTitleAndTooltip( "Transmission Mode", "Specify the transmission mode of the HDLC frames" );
    mHdlcTransmissionInterface->AddNumber( HDLC_TRANSMISSION_BIT_SYNC, "Bit Synchronous", "Bit-oriented transmission using bit stuffing" );
    mHdlcTransmissionInterface->AddNumber( HDLC_TRANSMISSION_BYTE_ASYNC, "Byte Asynchronous",
                                           "Byte asynchronous transmission using byte stuffing (Also known as start/stop mode)" );
    mHdlcTransmissionInterface->SetNumber( mTransmissionMode );

    mHdlcAddrInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcAddrInterface->SetTitleAndTooltip( "Address Field Type", "Specify the address field type of an HDLC frame." );
    mHdlcAddrInterface->AddNumber( HDLC_BASIC_ADDRESS_FIELD, "Basic", "Basic Address Field (8 bits)" );
    mHdlcAddrInterface->AddNumber( HDLC_EXTENDED_ADDRESS_FIELD, "Extended", "Extended Address Field (8 or more bits)" );
    mHdlcAddrInterface->SetNumber( mHdlcAddr );

    mHdlcControlInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcControlInterface->SetTitleAndTooltip( "Control Field Format", "Specify the Control Field type of a HDLC frame." );
    mHdlcControlInterface->AddNumber( HDLC_BASIC_CONTROL_FIELD, "Basic - Modulo 8", "Control Field of 8 bits" );
    mHdlcControlInterface->AddNumber( HDLC_EXTENDED_CONTROL_FIELD_MOD_128, "Extended - Modulo 128", "Control Field of 16 bits" );
    mHdlcControlInterface->AddNumber( HDLC_EXTENDED_CONTROL_FIELD_MOD_32768, "Extended - Modulo 32768", "Control Field of 32 bits" );
    mHdlcControlInterface->AddNumber( HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648, "Extended - Modulo 2147483648",
                                      "Control Field of 64 bits" );
    mHdlcControlInterface->SetNumber( mHdlcControl );

    mHdlcFcsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcFcsInterface->SetTitleAndTooltip( "FCS Type", "Specify the Frame Check Sequence of an HDLC frame" );
    mHdlcFcsInterface->AddNumber( HDLC_CRC8, "CRC-8", "8-bit Cyclic Redundancy Check" );
    mHdlcFcsInterface->AddNumber( HDLC_CRC16, "CRC-16-CCITT", "16-bit Cyclic Redundancy Check" );
    mHdlcFcsInterface->AddNumber( HDLC_CRC32, "CRC-32", "32-bit Cyclic Redundancy Check" );
    mHdlcFcsInterface->SetNumber( mHdlcFcs );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mHdlcTransmissionInterface.get() );
    AddInterface( mHdlcAddrInterface.get() );
    AddInterface( mHdlcControlInterface.get() );
    AddInterface( mHdlcFcsInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "HDLC", false );
}